

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::ArgumentParser::index_argument(ArgumentParser *this,list_iterator argIt)

{
  bool bVar1;
  pointer this_00;
  key_type kVar2;
  key_type local_48;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *mName;
  const_iterator __end2;
  const_iterator __begin2;
  add_const_t<std::vector<std::__cxx11::basic_string<char>_>_> *__range2;
  ArgumentParser *this_local;
  list_iterator argIt_local;
  
  this_local = (ArgumentParser *)argIt._M_node;
  this_00 = std::_List_iterator<argparse::Argument>::operator->
                      ((_List_iterator<argparse::Argument> *)&this_local);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this_00->mNames);
  mName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this_00->mNames);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&mName);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
    kVar2 = (key_type)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    local_48 = kVar2;
    std::
    map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
    ::insert_or_assign<std::_List_iterator<argparse::Argument>&>
              ((map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                *)&this->mArgumentMap,&local_48,(_List_iterator<argparse::Argument> *)&this_local);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void index_argument(list_iterator argIt) {
    for (auto &mName : std::as_const(argIt->mNames))
      mArgumentMap.insert_or_assign(mName, argIt);
  }